

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void rollback_to_zero_test(bool multi_kv)

{
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  fdb_kvs_handle **ppfVar6;
  long lVar7;
  undefined7 in_register_00000039;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  fdb_file_handle *dbfile;
  int local_554;
  fdb_kvs_handle **local_550;
  fdb_kvs_handle *local_548 [4];
  fdb_kvs_info info;
  fdb_kvs_config kvs_config;
  char kv_name [8];
  timeval __test_begin;
  fdb_doc *local_4c8 [20];
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.multi_kv_instances = multi_kv;
  fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  local_554 = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_554 == 0) {
    fdb_kvs_open_default(dbfile,local_548,&kvs_config);
    lVar7 = 1;
  }
  else {
    ppfVar6 = local_548;
    lVar7 = 4;
    for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
      sprintf(kv_name,"kv%d",uVar8 & 0xffffffff);
      fdb_kvs_open(dbfile,ppfVar6,kv_name,&kvs_config);
      ppfVar6 = ppfVar6 + 1;
    }
  }
  lVar9 = 0;
  while (lVar7 != lVar9) {
    fVar1 = fdb_set_log_callback(local_548[lVar9],logCallbackFunc,"rollback_to_zero_test");
    lVar9 = lVar9 + 1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1027);
      rollback_to_zero_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1027,"void rollback_to_zero_test(bool)");
    }
  }
  local_550 = local_548;
  for (uVar8 = 0; uVar8 != 5; uVar8 = uVar8 + 1) {
    sprintf(keybuf,"key%d",uVar8 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar8 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar8 & 0xffffffff);
    sVar2 = strlen(keybuf);
    sVar3 = strlen(metabuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar8,keybuf,sVar2,metabuf,sVar3,bodybuf,sVar4);
    for (lVar9 = 0; lVar7 != lVar9; lVar9 = lVar9 + 1) {
      fdb_set(local_548[lVar9],local_4c8[uVar8]);
    }
  }
  fdb_commit(dbfile,'\x01');
  for (uVar8 = 5; uVar8 != 10; uVar8 = uVar8 + 1) {
    sprintf(keybuf,"key%d",uVar8 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar8 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar8 & 0xffffffff);
    sVar2 = strlen(keybuf);
    sVar3 = strlen(metabuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar8,keybuf,sVar2,metabuf,sVar3,bodybuf,sVar4);
    for (lVar9 = 0; lVar7 != lVar9; lVar9 = lVar9 + 1) {
      fdb_set(local_548[lVar9],local_4c8[uVar8]);
    }
  }
  fdb_commit(dbfile,'\0');
  for (uVar8 = 10; uVar8 != 0xf; uVar8 = uVar8 + 1) {
    sprintf(keybuf,"key%d",uVar8 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar8 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar8 & 0xffffffff);
    sVar2 = strlen(keybuf);
    sVar3 = strlen(metabuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar8,keybuf,sVar2,metabuf,sVar3,bodybuf,sVar4);
    for (lVar9 = 0; lVar7 != lVar9; lVar9 = lVar9 + 1) {
      fdb_set(local_548[lVar9],local_4c8[uVar8]);
    }
  }
  fdb_commit(dbfile,'\x01');
  for (uVar8 = 0xf; uVar8 != 0x14; uVar8 = uVar8 + 1) {
    sprintf(keybuf,"key%d",uVar8 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar8 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar8 & 0xffffffff);
    sVar2 = strlen(keybuf);
    sVar3 = strlen(metabuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar8,keybuf,sVar2,metabuf,sVar3,bodybuf,sVar4);
    for (lVar9 = 0; lVar7 != lVar9; lVar9 = lVar9 + 1) {
      fdb_set(local_548[lVar9],local_4c8[uVar8]);
    }
  }
  fdb_commit(dbfile,'\0');
  if ((char)local_554 == '\0') {
    fVar1 = fdb_rollback(local_548,0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1067);
      rollback_to_zero_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1067,"void rollback_to_zero_test(bool)");
    }
    fVar1 = fdb_get_kvs_info(local_548[0],&info);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1069);
      rollback_to_zero_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1069,"void rollback_to_zero_test(bool)");
    }
    if (info.last_seqnum != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x106a);
      rollback_to_zero_test(bool)::__test_pass = '\x01';
      if (info.last_seqnum != 0) {
        __assert_fail("info.last_seqnum == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x106a,"void rollback_to_zero_test(bool)");
      }
    }
    if (info.doc_count != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x106b);
      rollback_to_zero_test(bool)::__test_pass = '\x01';
      if (info.doc_count != 0) {
        __assert_fail("info.doc_count == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x106b,"void rollback_to_zero_test(bool)");
      }
    }
    if (info.space_used != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x106c);
      rollback_to_zero_test(bool)::__test_pass = '\x01';
      if (info.space_used != 0) {
        __assert_fail("info.space_used == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x106c,"void rollback_to_zero_test(bool)");
      }
    }
    fVar1 = fdb_get(local_548[0],local_4c8[0]);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x106e);
      rollback_to_zero_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x106e,"void rollback_to_zero_test(bool)");
    }
    fVar1 = fdb_set(local_548[0],local_4c8[0]);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1070);
      rollback_to_zero_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1070,"void rollback_to_zero_test(bool)");
    }
  }
  else {
    while (ppfVar6 = local_550, bVar10 = lVar7 != 0, lVar7 = lVar7 + -1, bVar10) {
      fVar1 = fdb_rollback(local_550,0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1074);
        rollback_to_zero_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1074,"void rollback_to_zero_test(bool)");
      }
      fVar1 = fdb_get_kvs_info(*ppfVar6,&info);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1076);
        rollback_to_zero_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1076,"void rollback_to_zero_test(bool)");
      }
      if (info.last_seqnum != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1077);
        rollback_to_zero_test(bool)::__test_pass = '\x01';
        if (info.last_seqnum != 0) {
          __assert_fail("info.last_seqnum == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1077,"void rollback_to_zero_test(bool)");
        }
      }
      if (info.doc_count != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1078);
        rollback_to_zero_test(bool)::__test_pass = '\x01';
        if (info.doc_count != 0) {
          __assert_fail("info.doc_count == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1078,"void rollback_to_zero_test(bool)");
        }
      }
      if (info.space_used != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1079);
        rollback_to_zero_test(bool)::__test_pass = '\x01';
        if (info.space_used != 0) {
          __assert_fail("info.space_used == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1079,"void rollback_to_zero_test(bool)");
        }
      }
      ppfVar6 = local_550;
      fVar1 = fdb_get(*local_550,local_4c8[0]);
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x107b);
        rollback_to_zero_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x107b,"void rollback_to_zero_test(bool)");
      }
      fVar1 = fdb_set(*ppfVar6,local_4c8[0]);
      local_550 = ppfVar6 + 1;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x107e);
        rollback_to_zero_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x107e,"void rollback_to_zero_test(bool)");
      }
    }
  }
  fVar1 = fdb_commit(dbfile,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_close(dbfile);
    for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 1) {
      fdb_doc_free(local_4c8[lVar7]);
    }
    fdb_shutdown();
    memleak_end();
    pcVar5 = "single kv mode:";
    if ((char)local_554 != '\0') {
      pcVar5 = "multiple kv mode:";
    }
    sprintf(bodybuf,"rollback to zero test %s",pcVar5);
    pcVar5 = "%s PASSED\n";
    if (rollback_to_zero_test(bool)::__test_pass != '\0') {
      pcVar5 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar5,bodybuf);
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x1084);
  rollback_to_zero_test(bool)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1084,"void rollback_to_zero_test(bool)");
}

Assistant:

void rollback_to_zero_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info info;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_to_zero_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    if (!multi_kv) {
        status = fdb_rollback(&db[0], 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_get_kvs_info(db[0], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == 0);
        TEST_CHK(info.doc_count == 0);
        TEST_CHK(info.space_used == 0);
        status = fdb_get(db[0], doc[0]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        status = fdb_set(db[0], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        for (r = 0; r < num_kvs; ++r) {
            status = fdb_rollback(&db[r], 0);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_info(db[r], &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == 0);
            TEST_CHK(info.doc_count == 0);
            TEST_CHK(info.space_used == 0);
            status = fdb_get(db[r], doc[0]);
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
            // test normal operation after rollback
            status = fdb_set(db[r], doc[0]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // test normal operation after rollbacks manually flush WAL & commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback to zero test %s", multi_kv ? "multiple kv mode:"
                                                          : "single kv mode:");
    TEST_RESULT(bodybuf);
}